

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_sset(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  CHAR_DATA *txt;
  bool fAll;
  int sn;
  int value;
  CHAR_DATA *victim;
  char arg3 [4608];
  char arg2 [4608];
  char arg1 [4608];
  CHAR_DATA *in_stack_ffffffffffffc9c8;
  undefined7 in_stack_ffffffffffffc9d0;
  undefined1 in_stack_ffffffffffffc9d7;
  undefined4 in_stack_ffffffffffffc9d8;
  int iVar4;
  uint in_stack_ffffffffffffc9dc;
  char *in_stack_ffffffffffffc9e0;
  char local_3618 [4608];
  char local_2418 [4584];
  char *in_stack_ffffffffffffedd0;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  char local_1218;
  
  one_argument((char *)CONCAT17(in_stack_ffffffffffffc9d7,in_stack_ffffffffffffc9d0),
               (char *)in_stack_ffffffffffffc9c8);
  one_argument((char *)CONCAT17(in_stack_ffffffffffffc9d7,in_stack_ffffffffffffc9d0),
               (char *)in_stack_ffffffffffffc9c8);
  one_argument((char *)CONCAT17(in_stack_ffffffffffffc9d7,in_stack_ffffffffffffc9d0),
               (char *)in_stack_ffffffffffffc9c8);
  if (((local_1218 == '\0') || (local_2418[0] == '\0')) || (local_3618[0] == '\0')) {
    send_to_char(in_stack_ffffffffffffc9e0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
    send_to_char(in_stack_ffffffffffffc9e0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
    send_to_char(in_stack_ffffffffffffc9e0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
    send_to_char(in_stack_ffffffffffffc9e0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
  }
  else {
    txt = get_char_world(in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0);
    if (txt == (CHAR_DATA *)0x0) {
      send_to_char((char *)0x0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
    }
    else {
      bVar1 = is_npc(in_stack_ffffffffffffc9c8);
      if (bVar1) {
        send_to_char((char *)txt,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
      }
      else {
        bVar1 = str_cmp(local_2418,"all");
        bVar2 = (bVar1 ^ 0xffU) & 1;
        iVar4 = 0;
        if ((bVar2 == 0) &&
           (iVar4 = skill_lookup((char *)((ulong)in_stack_ffffffffffffc9dc << 0x20)), iVar4 < 0)) {
          send_to_char((char *)txt,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9dc,iVar4));
        }
        else {
          bVar1 = is_number((char *)in_stack_ffffffffffffc9c8);
          if (bVar1) {
            iVar3 = atoi(local_3618);
            if (((iVar3 < 0) || (100 < iVar3)) && (iVar3 != -2)) {
              send_to_char((char *)txt,(CHAR_DATA *)CONCAT44(iVar3,iVar4));
            }
            else if ((bVar2 & 1) == 0) {
              txt->pcdata->learned[iVar4] = (short)iVar3;
            }
            else {
              for (iVar4 = 0; iVar4 < 800; iVar4 = iVar4 + 1) {
                if (skill_table[iVar4].name != (char *)0x0) {
                  txt->pcdata->learned[iVar4] = (short)iVar3;
                }
              }
            }
          }
          else {
            send_to_char((char *)txt,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9dc,iVar4));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_sset(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	int value;
	int sn;
	bool fAll;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	argument = one_argument(argument, arg3);

	if (arg1[0] == '\0' || arg2[0] == '\0' || arg3[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  set skill <name> <spell or skill> <value>\n\r", ch);
		send_to_char("  set skill <name> all <value>\n\r", ch);
		send_to_char("   (use the name of the skill, not the number)\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Not on NPC's.\n\r", ch);
		return;
	}

	fAll = !str_cmp(arg2, "all");
	sn = 0;

	if (!fAll && (sn = skill_lookup(arg2)) < 0)
	{
		send_to_char("No such skill or spell.\n\r", ch);
		return;
	}

	/*
	 * Snarf the value.
	 */
	if (!is_number(arg3))
	{
		send_to_char("Value must be numeric.\n\r", ch);
		return;
	}

	value = atoi(arg3);

	if ((value < 0 || value > 100) && (value != -2))
	{
		send_to_char("Value range is 0 to 100 (-2 for permanent strip).\n\r", ch);
		return;
	}

	if (fAll)
	{
		for (sn = 0; sn < MAX_SKILL; sn++)
		{
			if (skill_table[sn].name != nullptr)
				victim->pcdata->learned[sn] = value;
		}
	}
	else
	{
		victim->pcdata->learned[sn] = value;
	}
}